

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastInstancesIterator::
init<Kernel::TypedTermList>
          (FastInstancesIterator *this,
          SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs> *parent,Node *root,
          TypedTermList query,bool retrieveSubstitution,bool reversed)

{
  TypedTermList term;
  byte bVar1;
  FastInstancesIterator *in_RCX;
  Entry *in_RDX;
  long in_RSI;
  InstMatcher *in_RDI;
  uint64_t in_R8;
  byte in_R9B;
  byte in_stack_00000008;
  VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *in_stack_ffffffffffffffa8;
  VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *in_stack_ffffffffffffffb0;
  SortId in_stack_ffffffffffffffc0;
  undefined1 local_38 [14];
  byte local_2a;
  byte local_29;
  Entry *local_28;
  long local_20;
  anon_class_8_1_8991fb9c local_10;
  TermList local_8;
  
  local_29 = in_R9B & 1;
  local_2a = in_stack_00000008 & 1;
  *(byte *)&(in_RDI->_boundVars)._capacity = local_29;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_10.this = in_RCX;
  local_8._content = in_R8;
  bVar1 = (**(code **)(*(long *)&in_RDX->field_0 + 0x10))();
  *(byte *)((long)&(in_RDI->_boundVars)._capacity + 1) = bVar1 & 1;
  if (((ulong)(in_RDI->_boundVars)._capacity & 0x100) == 0) {
    Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::getEmpty();
  }
  else {
    (**(code **)(*(long *)&local_28->field_0 + 0x40))(local_38);
  }
  Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::operator=
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::~VirtualIterator
            ((VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *)in_RDI);
  in_RDI[1]._bindings._afterLast = local_28;
  InstanceCntr::InstanceCntr((InstanceCntr *)&stack0xffffffffffffffc7,(Cntr *)(local_20 + 0x10));
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::reset(in_RDI);
  term._sort._content = in_stack_ffffffffffffffc0._content;
  term.super_TermList._content = local_8._content;
  createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastInstancesIterator::init<Kernel::TypedTermList>(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node*,Kernel::TypedTermList,bool,bool)::_lambda(unsigned_int,Kernel::TermList)_1_>
            ((SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs> *)in_RDI,term,
             SUB81((ulong)in_RDI >> 0x38,0),local_10);
  if (((in_RDI->_boundVars)._capacity & 0x100) != 0) {
    SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::onLeafEntered
              ((InstMatcher *)0x3fd9db);
  }
  return;
}

Assistant:

void init(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed) {
        _retrieveSubstitution = retrieveSubstitution;
        _inLeaf = root->isLeaf();
        _ldIterator = _inLeaf ? static_cast<Leaf*>(root)->allChildren() : LDIterator::getEmpty();
        _root = root;
        _iterCntr = parent->_iterCnt;
        _subst.reset();

        ASS(root);

        parent->createBindings(query, reversed,
            [&](unsigned var, TermList t) { _subst.bindSpecialVar(var, t); });

        if (_inLeaf) {
          _subst.onLeafEntered(); //we reset the bindings cache
        }
      }